

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  __m128i *palVar3;
  parasail_profile_t *ppVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  longlong lVar8;
  char *pcVar9;
  long lVar10;
  int *piVar11;
  longlong lVar12;
  long lVar13;
  ulong uVar14;
  __m128i *palVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  size_t size;
  ulong uVar19;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    pcVar9 = "matrix";
  }
  else {
    if (s1 != (char *)0x0 || matrix->type != 0) {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar1 = matrix->size;
      lVar13 = (long)(int)uVar1;
      uVar18 = (long)(_s1Len + 1) / 2;
      iVar2 = (int)uVar18;
      size = iVar2 * lVar13;
      palVar3 = parasail_memalign___m128i(0x10,size);
      if (palVar3 != (__m128i *)0x0) {
        ppVar4 = parasail_profile_new(s1,_s1Len,matrix);
        uVar14 = 0;
        if (ppVar4 != (parasail_profile_t *)0x0) {
          uVar18 = uVar18 & 0xffffffff;
          if (iVar2 < 1) {
            uVar18 = uVar14;
          }
          uVar6 = 0;
          if (0 < (int)uVar1) {
            uVar6 = (ulong)uVar1;
          }
          lVar10 = (long)_s1Len;
          lVar7 = 0;
          do {
            if (uVar14 == uVar6) {
              (ppVar4->profile64).score = palVar3;
              ppVar4->free = parasail_free___m128i;
              return ppVar4;
            }
            iVar5 = (int)lVar7;
            lVar7 = uVar18 + (long)iVar5;
            palVar15 = palVar3 + iVar5;
            lVar16 = 0;
            lVar17 = (long)iVar2;
            for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
              if (matrix->type == 0) {
                if ((long)uVar19 < lVar10) {
                  piVar11 = matrix->matrix +
                            uVar14 * lVar13 + (long)matrix->mapper[(byte)s1[uVar19]];
                  goto LAB_0054b707;
                }
LAB_0054b70d:
                lVar12 = 0;
              }
              else {
                if (lVar10 <= (long)uVar19) goto LAB_0054b70d;
                piVar11 = (int *)((long)matrix->matrix +
                                 lVar16 + (long)matrix->mapper[(byte)matrix->alphabet[uVar14]] * 4);
LAB_0054b707:
                lVar12 = (longlong)*piVar11;
              }
              if (matrix->type == 0) {
                if (lVar17 < lVar10) {
                  piVar11 = matrix->matrix +
                            uVar14 * lVar13 + (long)matrix->mapper[(byte)s1[lVar17]];
                  goto LAB_0054b75b;
                }
LAB_0054b760:
                lVar8 = 0;
              }
              else {
                if (lVar10 <= lVar17) goto LAB_0054b760;
                piVar11 = (int *)((long)matrix->matrix +
                                 lVar16 + size * 4 +
                                          (long)matrix->mapper[(byte)matrix->alphabet[uVar14]] * 4);
LAB_0054b75b:
                lVar8 = (longlong)*piVar11;
              }
              (*palVar15)[0] = lVar12;
              (*palVar15)[1] = lVar8;
              palVar15 = palVar15 + 1;
              lVar17 = lVar17 + 1;
              lVar16 = lVar16 + lVar13 * 4;
            }
            uVar14 = uVar14 + 1;
          } while( true );
        }
      }
      return (parasail_profile_t *)0x0;
    }
    pcVar9 = "s1";
  }
  fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_sse_128_64",pcVar9);
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}